

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_comp_fixup(jit_State *J,BCIns *pc,int cond)

{
  uint uVar1;
  BCReg BVar2;
  uint32_t uVar3;
  SnapShot *pSVar4;
  SnapEntry *pSVar5;
  int iVar6;
  BCReg BVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint8_t auStack_138 [264];
  
  uVar9 = pc[1] >> 8 & 0xff;
  iVar6 = (pc[1] >> 0x10) - 0x8000;
  if (cond == 0) {
    iVar6 = 0;
  }
  uVar10 = (ulong)(J->cur).nsnap;
  pSVar4 = (J->cur).snap;
  (J->cur).snapmap[(uint)pSVar4[uVar10 - 1].nent + pSVar4[uVar10 - 1].mapofs] =
       (int)pc + iVar6 * 4 + 8;
  J->needsnap = '\x01';
  if (uVar9 < J->maxslot) {
    J->maxslot = uVar9;
    lj_snap_shrink(J);
    return;
  }
  pSVar4 = (J->cur).snap;
  uVar10 = (ulong)(J->cur).nsnap;
  uVar9 = pSVar4[uVar10 - 1].mapofs;
  pSVar5 = (J->cur).snapmap;
  uVar14 = (ulong)pSVar4[uVar10 - 1].nent;
  uVar1 = J->maxslot;
  BVar2 = J->baseslot;
  BVar7 = snap_usedef(J,auStack_138,(BCIns *)(ulong)pSVar5[uVar9 + uVar14],uVar1);
  if (BVar7 < uVar1) {
    snap_useuv(J->pt,auStack_138);
  }
  pSVar4[uVar10 - 1].nslots = (uint8_t)(uVar1 + BVar2);
  uVar8 = 0;
  for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
    uVar12 = pSVar5[uVar9 + uVar11] >> 0x18;
    if ((uVar12 < BVar7 + BVar2) ||
       ((uVar12 < uVar1 + BVar2 && (auStack_138[uVar12 - BVar2] == '\0')))) {
      uVar13 = (ulong)uVar8;
      uVar8 = uVar8 + 1;
      pSVar5[uVar9 + uVar13] = pSVar5[uVar9 + uVar11];
    }
  }
  pSVar4[uVar10 - 1].nent = (uint8_t)uVar8;
  uVar1 = pSVar4[uVar10 - 1].mapofs;
  uVar3 = (J->cur).nsnapmap;
  for (; (uint)uVar14 <= ~uVar1 + uVar3; uVar14 = (ulong)((uint)uVar14 + 1)) {
    uVar11 = (ulong)uVar8;
    uVar8 = uVar8 + 1;
    pSVar5[uVar9 + uVar11] = pSVar5[uVar9 + uVar14];
  }
  (J->cur).nsnapmap = uVar8 + pSVar4[uVar10 - 1].mapofs;
  return;
}

Assistant:

static void rec_comp_fixup(jit_State *J, const BCIns *pc, int cond)
{
  BCIns jmpins = pc[1];
  const BCIns *npc = pc + 2 + (cond ? bc_j(jmpins) : 0);
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  /* Set PC to opposite target to avoid re-recording the comp. in side trace. */
#if LJ_FR2
  SnapEntry *flink = &J->cur.snapmap[snap->mapofs + snap->nent];
  uint64_t pcbase;
  memcpy(&pcbase, flink, sizeof(uint64_t));
  pcbase = (pcbase & 0xff) | (u64ptr(npc) << 8);
  memcpy(flink, &pcbase, sizeof(uint64_t));
#else
  J->cur.snapmap[snap->mapofs + snap->nent] = SNAP_MKPC(npc);
#endif
  J->needsnap = 1;
  if (bc_a(jmpins) < J->maxslot) J->maxslot = bc_a(jmpins);
  lj_snap_shrink(J);  /* Shrink last snapshot if possible. */
}